

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# re2.cc
# Opt level: O1

Prog * __thiscall re2::RE2::ReverseProg(RE2 *this)

{
  int iVar1;
  undefined8 uVar2;
  long *in_FS_OFFSET;
  undefined1 local_31;
  RE2 *local_30;
  undefined1 *local_28;
  RE2 **local_20;
  
  local_20 = &local_30;
  local_28 = &local_31;
  *in_FS_OFFSET = (long)&local_28;
  *in_FS_OFFSET =
       (long)std::once_flag::_Prepare_execution::
             _Prepare_execution<(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/mutex:775:25)>
             ::anon_class_1_0_00000001::__invoke;
  local_30 = this;
  iVar1 = pthread_once(&(this->rprog_once_)._M_once,__once_proxy);
  if (iVar1 == 0) {
    *in_FS_OFFSET = 0;
    *in_FS_OFFSET = 0;
    return this->rprog_;
  }
  uVar2 = std::__throw_system_error(iVar1);
  *in_FS_OFFSET = 0;
  *in_FS_OFFSET = 0;
  _Unwind_Resume(uVar2);
}

Assistant:

re2::Prog* RE2::ReverseProg() const {
  std::call_once(rprog_once_, [](const RE2* re) {
    re->rprog_ =
        re->suffix_regexp_->CompileToReverseProg(re->options_.max_mem() / 3);
    if (re->rprog_ == NULL) {
      if (re->options_.log_errors())
        LOG(ERROR) << "Error reverse compiling '" << trunc(*re->pattern_)
                   << "'";
      // We no longer touch error_ and error_code_ because failing to compile
      // the reverse Prog is not a showstopper: falling back to NFA execution
      // is fine. More importantly, an RE2 object is supposed to be logically
      // immutable: whatever ok() would have returned after Init() completed,
      // it should continue to return that no matter what ReverseProg() does.
    }
  }, this);
  return rprog_;
}